

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::
Fold_Right_Binary_Operator_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
::eval_internal(Fold_Right_Binary_Operator_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
                *this,Dispatch_State *t_ss)

{
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  undefined1 auStack_38 [16];
  
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
            ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
             auStack_38,
             (Dispatch_State *)
             ((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock.__align);
  do_oper(this,t_ss,in_RDX,(Boxed_Value *)&t_ss->m_conversions);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_38 + 8));
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        return do_oper(t_ss, this->text, this->children[0]->eval(t_ss));
      }